

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O2

int phosg::fstat(int __fd,stat *__buf)

{
  int iVar1;
  cannot_stat_file *this;
  undefined4 in_register_0000003c;
  
  iVar1 = ::fstat((int)__buf,(stat *)CONCAT44(in_register_0000003c,__fd));
  if (iVar1 == 0) {
    return __fd;
  }
  this = (cannot_stat_file *)__cxa_allocate_exception(0x20);
  cannot_stat_file::cannot_stat_file(this,(int)__buf);
  __cxa_throw(this,&cannot_stat_file::typeinfo,cannot_stat_file::~cannot_stat_file);
}

Assistant:

struct stat fstat(int fd) {
  struct stat st;
  if (::fstat(fd, &st)) {
    throw cannot_stat_file(fd);
  }
  return st;
}